

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall
Object::projectEdge2Edge(Object *this,Edge *src,Vector2d *obs,Edge *dst,HeapType *heap)

{
  bool bVar1;
  CoeffReturnType pdVar2;
  size_type sVar3;
  Scalar *__args;
  undefined4 *puVar4;
  long in_RCX;
  Edge *in_RSI;
  double dist;
  Vector3d *pt;
  iterator __end2;
  iterator __begin2;
  Edge *__range2;
  int i_1;
  int i;
  int delete_cnt;
  Vector3d intersect;
  int id;
  Vector2d beam;
  double angle;
  Vector3d *task;
  iterator __end1;
  iterator __begin1;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range1;
  int task_id;
  bool dst_closer_1;
  Vector3d tmp_1;
  int e_id;
  bool dst_closer;
  Vector3d tmp;
  int f_id;
  Vector2d dst_b;
  Vector2d dst_f;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  tasks;
  size_t mid_id;
  bool mid_in_range;
  bool end_in_range;
  bool head_in_range;
  double e_ang;
  double f_ang;
  Vector2d ept;
  Vector2d fpt;
  bool pop_back_flag;
  _Self *in_stack_fffffffffffffaa8;
  _Self *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffac0;
  double *in_stack_fffffffffffffac8;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffad0;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
  *in_stack_fffffffffffffad8;
  double in_stack_fffffffffffffae0;
  Edge *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  Edge *in_stack_fffffffffffffb18;
  Vector3d *in_stack_fffffffffffffb38;
  Vector2d *in_stack_fffffffffffffb40;
  Vector2d *in_stack_fffffffffffffb48;
  Vector3d *in_stack_fffffffffffffb50;
  Vector3d *in_stack_fffffffffffffb58;
  Object *in_stack_fffffffffffffb60;
  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
  local_3e0;
  long local_3c0;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_37c;
  undefined8 local_338;
  reference local_330;
  Matrix<double,_3,_1,_0,_3,_1> *local_328;
  __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_320;
  undefined1 *local_318;
  int local_310;
  undefined1 local_309;
  int local_2f0;
  undefined1 local_2e9;
  int local_2cc;
  HeapType *in_stack_fffffffffffffda0;
  Edge *in_stack_fffffffffffffda8;
  Vector2d *in_stack_fffffffffffffdb0;
  Vector2d *in_stack_fffffffffffffdb8;
  Vector2d *in_stack_fffffffffffffdc0;
  Object *in_stack_fffffffffffffdc8;
  undefined1 local_170 [24];
  ulong local_158;
  byte local_14b;
  byte local_14a;
  byte local_149;
  double local_148;
  double local_140;
  byte local_29;
  long local_20;
  Edge *local_10;
  
  local_29 = 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_fffffffffffffac0);
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            (in_stack_fffffffffffffac0,CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
             ,(Index)in_stack_fffffffffffffab0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)in_stack_fffffffffffffac0);
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            (in_stack_fffffffffffffac0,CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
             ,(Index)in_stack_fffffffffffffab0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_fffffffffffffac0);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x1490d8);
  local_140 = *pdVar2;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)in_stack_fffffffffffffac0);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x1490fa);
  local_148 = *pdVar2;
  local_149 = Edge::angleInRange(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  local_14a = Edge::angleInRange(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  local_14b = 1;
  sVar3 = std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)0x14915a);
  if (2 < sVar3) {
    sVar3 = std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)0x14916d);
    local_158 = sVar3 >> 1;
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x1491a5);
    local_14b = Edge::angleInRange(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x1491cc);
  if (((local_149 & 1) == 0) || ((local_14a & 1) == 0)) {
    if ((local_149 & 1) == 0) {
      if ((local_14a & 1) == 0) {
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffac0);
        Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
                  (in_stack_fffffffffffffac0,
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (Index)in_stack_fffffffffffffab0);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *)
                   in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        Eigen::Matrix<double,2,1,0,2,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                  ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)in_stack_fffffffffffffaa8);
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffac0);
        Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
                  (in_stack_fffffffffffffac0,
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (Index)in_stack_fffffffffffffab0);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *)
                   in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        Eigen::Matrix<double,2,1,0,2,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                  ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)in_stack_fffffffffffffaa8);
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffac0);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x14951b);
        in_stack_fffffffffffffb14 =
             Edge::rotatedBinarySearch
                       (local_10,(double)CONCAT44(in_stack_fffffffffffffb14,
                                                  in_stack_fffffffffffffb10));
        in_stack_fffffffffffffb18 = local_10;
        local_2cc = in_stack_fffffffffffffb14;
        if (0 < in_stack_fffffffffffffb14) {
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x149561);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
          local_2e9 = rangeSuitable(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                                    in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                                    in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          in_stack_fffffffffffffb10 = CONCAT13(local_2e9,(int3)in_stack_fffffffffffffb10);
          in_stack_fffffffffffffb18 = local_10;
          if ((bool)local_2e9) goto LAB_00149c1c;
        }
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffac0);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x14961b);
        local_2f0 = Edge::rotatedBinarySearch
                              (in_stack_fffffffffffffb18,
                               (double)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                              );
        if (0 < local_2f0) {
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x149661);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
          local_309 = rangeSuitable(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                                    in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                                    in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          if ((bool)local_309) goto LAB_00149c1c;
        }
        if ((local_2cc < 1) && (local_2f0 < 1)) goto LAB_00149c1c;
        if ((0 < local_2cc) && (0 < local_2f0)) {
          *(undefined1 *)(local_20 + 0x58) = 0;
          goto LAB_00149c1c;
        }
        if (local_2cc < 1) {
          in_stack_fffffffffffffad0 =
               (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x1497b7);
          __args = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x1497cb);
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          emplace_back<double&,double&,double&>
                    ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)in_stack_fffffffffffffad0,__args,(double *)in_stack_fffffffffffffac0,
                     (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        }
        else {
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                    ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x149764);
          in_stack_fffffffffffffad8 =
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *
               )Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                          ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x149778);
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          emplace_back<double&,double&,double&>
                    ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                     (double *)in_stack_fffffffffffffac0,
                     (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
          local_29 = 0;
        }
      }
      else {
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x1493ec);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x149403);
        std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<double&,double&,double&>
                  ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                   (double *)in_stack_fffffffffffffac0,
                   (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        local_29 = 0;
      }
    }
    else {
      in_stack_fffffffffffffb40 =
           (Vector2d *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x149388);
      in_stack_fffffffffffffb38 =
           (Vector3d *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x14939f);
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double&,double&,double&>
                ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (double *)in_stack_fffffffffffffac0,
                 (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    }
  }
  else {
    if ((local_14b & 1) != 0) {
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffaa8);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffaa8);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffaa8);
      bVar1 = breakEdge(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      if (bVar1) goto LAB_00149c1c;
    }
    in_stack_fffffffffffffb60 =
         (Object *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                   ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x1492cf);
    in_stack_fffffffffffffb58 =
         (Vector3d *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                   ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x1492e6);
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (double *)in_stack_fffffffffffffac0,
               (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    in_stack_fffffffffffffb50 =
         (Vector3d *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                   ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x149324);
    in_stack_fffffffffffffb48 =
         (Vector2d *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                   ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x14933b);
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (double *)in_stack_fffffffffffffac0,
               (double *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  }
  local_310 = 0;
  local_318 = local_170;
  local_320._M_current =
       (Matrix<double,_3,_1,_0,_3,_1> *)
       std::
       vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ::begin((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffaa8);
  local_328 = (Matrix<double,_3,_1,_0,_3,_1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::end((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffaa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                             *)in_stack_fffffffffffffab0,
                            (__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                             *)in_stack_fffffffffffffaa8), bVar1) {
    local_330 = __gnu_cxx::
                __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                ::operator*(&local_320);
    if (0 < local_310) {
      local_29 = 0;
    }
    in_stack_fffffffffffffac0 =
         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::z
                   ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x149892);
    local_338 = *(undefined8 *)in_stack_fffffffffffffac0;
    Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
              (in_stack_fffffffffffffac0,
               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (Index)in_stack_fffffffffffffab0);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>
              ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffab0,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *)
               in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffabc =
         Edge::rotatedBinarySearch
                   (in_stack_fffffffffffffb18,
                    (double)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    local_37c = in_stack_fffffffffffffabc;
    if ((local_310 == 0) && (in_stack_fffffffffffffabc < 1)) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    if ((0 < local_310) && (in_stack_fffffffffffffabc < 1)) break;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffab0,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffab0 =
         (_Self *)std::
                  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
    bVar1 = rangeSuitable(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                          in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                          in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    in_stack_fffffffffffffab8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffab8);
    if (!bVar1) break;
    if ((local_29 & 1) == 1) {
      sVar3 = std::
              deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)0x149a26);
      local_3ac = (int)sVar3 - local_37c;
      for (local_3b0 = 0; local_3b0 < local_3ac; local_3b0 = local_3b0 + 1) {
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::pop_back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_fffffffffffffab0);
      }
      std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<Eigen::Matrix<double,3,1,0,3,1>&>
                ((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffab0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffaa8);
    }
    else {
      for (local_3b4 = 0; local_3b4 < local_37c; local_3b4 = local_3b4 + 1) {
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::pop_front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffab0);
      }
      std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>
                ((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffab0,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffaa8);
    }
    local_3c0 = local_20;
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::begin((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffffaa8);
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::end((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_fffffffffffffaa8);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8), bVar1) {
      std::
      _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
      ::operator*(&local_3e0);
      Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
                (in_stack_fffffffffffffac0,
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (Index)in_stack_fffffffffffffab0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>::operator-
                (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      in_stack_fffffffffffffaa8 =
           (_Self *)Eigen::
                    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            *)in_stack_fffffffffffffaa8);
      if ((double)in_stack_fffffffffffffaa8 < *(double *)(local_20 + 0x50)) {
        *(_Self **)(local_20 + 0x50) = in_stack_fffffffffffffaa8;
      }
      std::
      _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
      ::operator++(in_stack_fffffffffffffab0);
    }
    local_310 = local_310 + 1;
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&local_320);
  }
LAB_00149c1c:
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffffac0);
  return;
}

Assistant:

void Object::projectEdge2Edge(const Edge& src, const Eigen::Vector2d& obs, Edge& dst, HeapType& heap) {
    bool pop_back_flag = true;
    Eigen::Vector2d fpt = src.front().block<2, 1>(0, 0) - obs, ept = src.back().block<2, 1>(0, 0) - obs;
    double f_ang = src.front().z(), e_ang = src.back().z();
    bool head_in_range = dst.angleInRange(f_ang), end_in_range = dst.angleInRange(e_ang), mid_in_range = true;
    if (src.size() > 2) {
        size_t mid_id = src.size() / 2;
        mid_in_range = dst.angleInRange(src[mid_id].z());
    }
    std::vector<Eigen::Vector3d> tasks;
    if (head_in_range && end_in_range) {        
        if (mid_in_range) {                     // 加edge 打断
            LOG_ERROR_STREAM("Breaking edge!");
            if (breakEdge(fpt, ept, obs, dst, heap) == true)
                return;
        }                          // 特殊情况
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
    } else if (head_in_range) {
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
    } else if (end_in_range) {
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
        pop_back_flag = false;          // pop_front
    } else {                            // SRC的两个端点不在DST范围内（有可能完全遮挡的）
        const Eigen::Vector2d dst_f = dst.front().block<2, 1>(0, 0) - obs, dst_b = dst.back().block<2, 1>(0, 0) - obs;
        int f_id = src.rotatedBinarySearch(dst.front().z());
        if (f_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[f_id - 1], src[f_id], dst_f, obs, tmp);
            if (dst_closer == true) return;
        }
        int e_id = src.rotatedBinarySearch(dst.back().z());
        if (e_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[e_id - 1], src[e_id], dst_b, obs, tmp);
            if (dst_closer == true) return;        // 投影边的range更大
        }
        if (f_id <= 0 && e_id <= 0) return;          // 反向光线
        if (f_id > 0 && e_id > 0) {
            dst.valid = false;
            return;
        }
        if (f_id > 0) {
            tasks.emplace_back(ept.x(), ept.y(), e_ang);
            pop_back_flag = false;          // pop_front
        } else {
            tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        }
    }
    int task_id = 0;
    for (const Eigen::Vector3d& task: tasks) {
        if (task_id > 0) pop_back_flag = false;
        double angle = task.z();
        Eigen::Vector2d beam = task.block<2, 1>(0, 0);
        int id = dst.rotatedBinarySearch(angle);
        if (task_id == 0 && id <= 0) {
            LOG_ERROR_STREAM("Task is 0 and id <= 0");
            throw 0;
        } else if (task_id > 0 && id <= 0) break;
        Eigen::Vector3d intersect = Eigen::Vector3d::Zero();
        if (rangeSuitable(dst[id - 1], dst[id], beam, obs, intersect) == false) {
            return;
        }
        if (pop_back_flag == true) {            // 删除大角度
            int delete_cnt = static_cast<int>(dst.size()) - id;
            for (int i = 0; i < delete_cnt; i++)
                dst.pop_back();
            dst.emplace_back(intersect);
        } else {
            for (int i = 0; i < id; i++) {
                dst.pop_front();
            }
            dst.emplace_front(intersect);
        }
        for (const Eigen::Vector3d& pt: dst) {
            double dist = (pt.block<2, 1>(0, 0) - obs).norm();
            if (dist < dst.min_dist) dst.min_dist = dist;
        }
        task_id ++;
    }
}